

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void pbrt::ErrorExit<unsigned_long>(char *fmt,unsigned_long *args)

{
  string local_28;
  
  StringPrintf<unsigned_long>(&local_28,fmt,args);
  ErrorExit((FileLoc *)0x0,local_28._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}